

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.h
# Opt level: O3

void __thiscall TPZCompElDisc::SetFalseUseQsiEta(TPZCompElDisc *this)

{
  int iVar1;
  TPZGeoEl *pTVar2;
  TPZGeoEl *pTVar3;
  REAL RVar4;
  TPZManVector<double,_3> centerqsi;
  double local_50;
  TPZManVector<double,_3> local_48;
  
  this->fUseQsiEta = false;
  pTVar2 = TPZCompEl::Reference((TPZCompEl *)this);
  iVar1 = (**(code **)(*(long *)pTVar2 + 0x210))(pTVar2);
  local_50 = 0.0;
  TPZManVector<double,_3>::TPZManVector(&local_48,(long)iVar1,&local_50);
  pTVar2 = TPZCompEl::Reference((TPZCompEl *)this);
  pTVar3 = TPZCompEl::Reference((TPZCompEl *)this);
  iVar1 = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3);
  (**(code **)(*(long *)pTVar2 + 0x260))(pTVar2,iVar1 + -1,&local_48);
  TPZManVector<double,_3>::Resize(&this->fCenterPoint,3);
  pTVar2 = TPZCompEl::Reference((TPZCompEl *)this);
  (**(code **)(*(long *)pTVar2 + 0x228))(pTVar2,&local_48,&this->fCenterPoint);
  RVar4 = (REAL)(**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x348))
                          (this);
  this->fConstC = RVar4;
  TPZManVector<double,_3>::~TPZManVector(&local_48);
  return;
}

Assistant:

void SetFalseUseQsiEta(){
        fUseQsiEta = false;
        TPZManVector<REAL,3> centerqsi(Reference()->Dimension(),0);
        Reference()->CenterPoint(Reference()->NSides()-1,centerqsi);
        fCenterPoint.Resize(3);
        Reference()->X(centerqsi,fCenterPoint);
        fConstC = NormalizeConst();
    }